

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O1

void ncnn::convdw3x3s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  float *pfVar3;
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  uint uVar19;
  int iVar20;
  void *pvVar21;
  void *pvVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  int iVar86;
  long lVar87;
  float *pfVar88;
  int iVar89;
  uint uVar90;
  uint uVar91;
  long lVar92;
  int iVar93;
  long lVar94;
  float *pfVar95;
  float *pfVar96;
  float *pfVar97;
  undefined8 uVar98;
  undefined8 uVar102;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar18 = bottom_blob->c;
  if (0 < (long)iVar18) {
    uVar19 = top_blob->w;
    iVar20 = top_blob->h;
    pvVar21 = _bias->data;
    iVar86 = (bottom_blob->w - uVar19) * 8;
    lVar94 = 0;
    do {
      if (pvVar21 == (void *)0x0) {
        uVar98 = 0;
        uVar102 = 0;
      }
      else {
        puVar1 = (undefined8 *)((long)pvVar21 + lVar94 * 0x10);
        uVar98 = *puVar1;
        uVar102 = puVar1[1];
      }
      local_128 = (float)uVar98;
      fStack_124 = (float)((ulong)uVar98 >> 0x20);
      fStack_120 = (float)uVar102;
      fStack_11c = (float)((ulong)uVar102 >> 0x20);
      if (0 < iVar20) {
        pfVar97 = (float *)(top_blob->cstep * lVar94 * top_blob->elemsize + (long)top_blob->data);
        lVar87 = kernel->w * lVar94 * kernel->elemsize;
        pvVar22 = kernel->data;
        pauVar2 = (undefined1 (*) [12])((long)pvVar22 + lVar87);
        auVar83 = *pauVar2;
        local_a8 = (float)*(undefined8 *)*pauVar2;
        fStack_a4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_a0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_9c = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        auVar13 = *(undefined1 (*) [16])((long)pvVar22 + lVar87 + 0x10);
        pauVar2 = (undefined1 (*) [12])((long)pvVar22 + lVar87 + 0x20);
        auVar84 = *pauVar2;
        auVar81 = *pauVar2;
        pfVar88 = (float *)((long)pvVar22 + lVar87 + 0x30);
        fVar77 = *pfVar88;
        fVar78 = pfVar88[1];
        fVar79 = pfVar88[2];
        fVar80 = pfVar88[3];
        pauVar5 = (undefined1 (*) [12])((long)pvVar22 + lVar87 + 0x40);
        auVar85 = *pauVar5;
        auVar82 = *pauVar5;
        auVar14 = *(undefined1 (*) [16])((long)pvVar22 + lVar87 + 0x50);
        pfVar88 = (float *)((long)pvVar22 + lVar87 + 0x60);
        fVar73 = *pfVar88;
        fVar74 = pfVar88[1];
        fVar75 = pfVar88[2];
        fVar76 = pfVar88[3];
        auVar15 = *(undefined1 (*) [16])((long)pvVar22 + lVar87 + 0x70);
        auVar16 = *(undefined1 (*) [16])((long)pvVar22 + lVar87 + 0x80);
        pfVar95 = (float *)(bottom_blob->cstep * lVar94 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
        lVar87 = (long)bottom_blob->w * bottom_blob->elemsize;
        pfVar88 = (float *)((long)pfVar95 + lVar87 * 2);
        pfVar96 = (float *)(lVar87 + (long)pfVar95);
        iVar93 = 0;
        local_c8 = (float)*(undefined8 *)*pauVar2;
        fStack_c4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
        fStack_c0 = (float)*(undefined8 *)(*pauVar2 + 8);
        fStack_bc = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
        local_d8 = (float)*(undefined8 *)*pauVar5;
        fStack_d4 = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
        fStack_d0 = (float)*(undefined8 *)(*pauVar5 + 8);
        fStack_cc = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
        do {
          fStack_104 = auVar13._4_4_;
          fStack_100 = auVar13._8_4_;
          fStack_fc = auVar13._12_4_;
          local_78 = auVar16._0_4_;
          fStack_74 = auVar16._4_4_;
          fStack_70 = auVar16._8_4_;
          fStack_6c = auVar16._12_4_;
          local_e8 = auVar14._0_4_;
          fStack_e4 = auVar14._4_4_;
          fStack_e0 = auVar14._8_4_;
          fStack_dc = auVar14._12_4_;
          local_b8 = auVar15._0_4_;
          fStack_b4 = auVar15._4_4_;
          fStack_b0 = auVar15._8_4_;
          fStack_ac = auVar15._12_4_;
          local_108 = auVar13._0_4_;
          if ((int)uVar19 < 4) {
            uVar90 = 0;
          }
          else {
            iVar89 = 3;
            do {
              fVar23 = pfVar95[1];
              fVar24 = pfVar95[2];
              fVar25 = pfVar95[3];
              fVar26 = pfVar95[5];
              fVar27 = pfVar95[6];
              fVar28 = pfVar95[7];
              fVar29 = pfVar95[8];
              fVar30 = pfVar95[9];
              fVar31 = pfVar95[10];
              fVar32 = pfVar95[0xb];
              fVar33 = pfVar96[1];
              fVar34 = pfVar96[2];
              fVar35 = pfVar96[3];
              fVar36 = pfVar96[5];
              fVar37 = pfVar96[6];
              fVar38 = pfVar96[7];
              fVar39 = pfVar96[8];
              fVar40 = pfVar96[9];
              fVar41 = pfVar96[10];
              fVar42 = pfVar96[0xb];
              fVar43 = pfVar88[1];
              fVar44 = pfVar88[2];
              fVar45 = pfVar88[3];
              fVar46 = pfVar88[5];
              fVar47 = pfVar88[6];
              fVar48 = pfVar88[7];
              fVar49 = pfVar95[0xc];
              fVar50 = pfVar95[0xd];
              fVar51 = pfVar95[0xe];
              fVar52 = pfVar95[0xf];
              fVar53 = pfVar88[8];
              fVar54 = pfVar88[9];
              fVar55 = pfVar88[10];
              fVar56 = pfVar88[0xb];
              fVar57 = pfVar96[0xc];
              fVar58 = pfVar96[0xd];
              fVar59 = pfVar96[0xe];
              fVar60 = pfVar96[0xf];
              fVar61 = pfVar88[0xc];
              fVar62 = pfVar88[0xd];
              fVar63 = pfVar88[0xe];
              fVar64 = pfVar88[0xf];
              fVar65 = pfVar96[0x10];
              fVar66 = pfVar96[0x11];
              fVar67 = pfVar96[0x12];
              fVar68 = pfVar96[0x13];
              local_48 = (float)*(undefined8 *)(pfVar95 + 0x10);
              fStack_44 = (float)((ulong)*(undefined8 *)(pfVar95 + 0x10) >> 0x20);
              fStack_40 = (float)*(undefined8 *)(pfVar95 + 0x12);
              fStack_3c = (float)((ulong)*(undefined8 *)(pfVar95 + 0x12) >> 0x20);
              fVar69 = pfVar88[0x10];
              fVar70 = pfVar88[0x11];
              fVar71 = pfVar88[0x12];
              fVar72 = pfVar88[0x13];
              *pfVar97 = local_a8 * *pfVar95 + local_128 +
                         local_108 * pfVar95[4] + fVar29 * local_c8 +
                         fVar39 * local_e8 + fVar77 * *pfVar96 + local_d8 * pfVar96[4] +
                         fVar73 * *pfVar88 + local_b8 * pfVar88[4] + fVar53 * local_78;
              pfVar97[1] = fStack_a4 * fVar23 + fStack_124 +
                           fStack_104 * fVar26 + fVar30 * fStack_c4 +
                           fVar40 * fStack_e4 + fVar78 * fVar33 + fStack_d4 * fVar36 +
                           fVar74 * fVar43 + fStack_b4 * fVar46 + fVar54 * fStack_74;
              pfVar97[2] = fStack_a0 * fVar24 + fStack_120 +
                           fStack_100 * fVar27 + fVar31 * fStack_c0 +
                           fVar41 * fStack_e0 + fVar79 * fVar34 + fStack_d0 * fVar37 +
                           fVar75 * fVar44 + fStack_b0 * fVar47 + fVar55 * fStack_70;
              pfVar97[3] = fStack_9c * fVar25 + fStack_11c + fStack_fc * fVar28 + fVar32 * fStack_bc
                           + fVar42 * fStack_dc + fVar80 * fVar35 + fStack_cc * fVar38 +
                           fVar76 * fVar45 + fStack_ac * fVar48 + fVar56 * fStack_6c;
              auVar101 = *(undefined1 (*) [16])(pfVar95 + 0x18);
              auVar17 = *(undefined1 (*) [16])(pfVar96 + 0x18);
              fVar23 = pfVar88[0x18];
              fVar24 = pfVar88[0x19];
              fVar25 = pfVar88[0x1a];
              fVar26 = pfVar88[0x1b];
              fVar27 = pfVar95[0x14];
              fVar28 = pfVar95[0x15];
              fVar33 = pfVar95[0x16];
              fVar34 = pfVar95[0x17];
              fVar35 = pfVar96[0x14];
              fVar36 = pfVar96[0x15];
              fVar37 = pfVar96[0x16];
              fVar38 = pfVar96[0x17];
              fVar43 = pfVar88[0x14];
              fVar44 = pfVar88[0x15];
              fVar45 = pfVar88[0x16];
              fVar46 = pfVar88[0x17];
              pfVar97[4] = fVar29 * local_a8 + local_128 + fVar39 * fVar77 + fVar53 * fVar73 +
                           local_d8 * fVar57 + local_108 * fVar49 + local_b8 * fVar61 +
                           local_48 * local_c8 + fVar65 * local_e8 + local_78 * fVar69;
              pfVar97[5] = fVar30 * fStack_a4 + fStack_124 + fVar40 * fVar78 + fVar54 * fVar74 +
                           fStack_d4 * fVar58 + fStack_104 * fVar50 + fStack_b4 * fVar62 +
                           fStack_44 * fStack_c4 + fVar66 * fStack_e4 + fStack_74 * fVar70;
              pfVar97[6] = fVar31 * fStack_a0 + fStack_120 + fVar41 * fVar79 + fVar55 * fVar75 +
                           fStack_d0 * fVar59 + fStack_100 * fVar51 + fStack_b0 * fVar63 +
                           fStack_40 * fStack_c0 + fVar67 * fStack_e0 + fStack_70 * fVar71;
              pfVar97[7] = fVar32 * fStack_9c + fStack_11c + fVar42 * fVar80 + fVar56 * fVar76 +
                           fStack_cc * fVar60 + fStack_fc * fVar52 + fStack_ac * fVar64 +
                           fStack_3c * fStack_bc + fVar68 * fStack_dc + fStack_6c * fVar72;
              fVar29 = pfVar95[0x1c];
              fVar30 = pfVar95[0x1d];
              fVar31 = pfVar95[0x1e];
              fVar32 = pfVar95[0x1f];
              fVar39 = pfVar95[0x20];
              fVar40 = pfVar95[0x21];
              fVar41 = pfVar95[0x22];
              fVar42 = pfVar95[0x23];
              fVar47 = pfVar96[0x1c];
              fVar48 = pfVar96[0x1d];
              fVar49 = pfVar96[0x1e];
              fVar50 = pfVar96[0x1f];
              fVar51 = pfVar96[0x20];
              fVar52 = pfVar96[0x21];
              fVar53 = pfVar96[0x22];
              fVar54 = pfVar96[0x23];
              fVar55 = pfVar88[0x1c];
              fVar56 = pfVar88[0x1d];
              fVar57 = pfVar88[0x1e];
              fVar58 = pfVar88[0x1f];
              fVar59 = pfVar88[0x20];
              fVar60 = pfVar88[0x21];
              fVar61 = pfVar88[0x22];
              fVar62 = pfVar88[0x23];
              pfVar97[8] = local_a8 * local_48 + local_128 + fVar65 * fVar77 + fVar69 * fVar73 +
                           local_108 * fVar27 + local_d8 * fVar35 + local_b8 * fVar43 +
                           fVar23 * local_78 + auVar17._0_4_ * local_e8 + auVar101._0_4_ * local_c8;
              pfVar97[9] = fStack_a4 * fStack_44 + fStack_124 + fVar66 * fVar78 + fVar70 * fVar74 +
                           fStack_104 * fVar28 + fStack_d4 * fVar36 + fStack_b4 * fVar44 +
                           fVar24 * fStack_74 +
                           auVar17._4_4_ * fStack_e4 + auVar101._4_4_ * fStack_c4;
              pfVar97[10] = fStack_a0 * fStack_40 + fStack_120 + fVar67 * fVar79 + fVar71 * fVar75 +
                            fStack_100 * fVar33 + fStack_d0 * fVar37 + fStack_b0 * fVar45 +
                            fVar25 * fStack_70 +
                            auVar17._8_4_ * fStack_e0 + auVar101._8_4_ * fStack_c0;
              pfVar97[0xb] = fStack_9c * fStack_3c + fStack_11c + fVar68 * fVar80 + fVar72 * fVar76
                             + fStack_fc * fVar34 + fStack_cc * fVar38 + fStack_ac * fVar46 +
                             fVar26 * fStack_6c +
                             auVar17._12_4_ * fStack_dc + auVar101._12_4_ * fStack_bc;
              auVar99._0_4_ =
                   auVar101._0_4_ * local_a8 + local_128 + auVar17._0_4_ * fVar77 + fVar23 * fVar73
                   + local_b8 * fVar55 + local_108 * fVar29 + local_d8 * fVar47 +
                   local_e8 * fVar51 + local_c8 * fVar39 + local_78 * fVar59;
              auVar99._4_4_ =
                   auVar101._4_4_ * fStack_a4 + fStack_124 +
                   auVar17._4_4_ * fVar78 + fVar24 * fVar74 +
                   fStack_b4 * fVar56 + fStack_104 * fVar30 + fStack_d4 * fVar48 +
                   fStack_e4 * fVar52 + fStack_c4 * fVar40 + fStack_74 * fVar60;
              auVar99._8_4_ =
                   auVar101._8_4_ * fStack_a0 + fStack_120 +
                   auVar17._8_4_ * fVar79 + fVar25 * fVar75 +
                   fStack_b0 * fVar57 + fStack_100 * fVar31 + fStack_d0 * fVar49 +
                   fStack_e0 * fVar53 + fStack_c0 * fVar41 + fStack_70 * fVar61;
              auVar99._12_4_ =
                   auVar101._12_4_ * fStack_9c + fStack_11c +
                   auVar17._12_4_ * fVar80 + fVar26 * fVar76 +
                   fStack_ac * fVar58 + fStack_fc * fVar32 + fStack_cc * fVar50 +
                   fStack_dc * fVar54 + fStack_bc * fVar42 + fStack_6c * fVar62;
              *(undefined1 (*) [16])(pfVar97 + 0xc) = auVar99;
              pfVar95 = pfVar95 + 0x20;
              pfVar96 = pfVar96 + 0x20;
              pfVar88 = pfVar88 + 0x20;
              pfVar97 = pfVar97 + 0x10;
              iVar89 = iVar89 + 4;
              uVar90 = uVar19 & 0xfffffffc;
            } while (iVar89 < (int)uVar19);
          }
          uVar91 = uVar90 | 1;
          while ((int)uVar91 < (int)uVar19) {
            auVar101 = *(undefined1 (*) [16])(pfVar95 + 8);
            auVar17 = *(undefined1 (*) [16])(pfVar96 + 8);
            auVar99 = *(undefined1 (*) [16])(pfVar88 + 8);
            fVar23 = pfVar95[1];
            fVar24 = pfVar95[2];
            fVar25 = pfVar95[3];
            fVar26 = pfVar95[5];
            fVar27 = pfVar95[6];
            fVar28 = pfVar95[7];
            fVar29 = pfVar96[1];
            fVar30 = pfVar96[2];
            fVar31 = pfVar96[3];
            fVar32 = pfVar96[5];
            fVar33 = pfVar96[6];
            fVar34 = pfVar96[7];
            fVar35 = pfVar88[1];
            fVar36 = pfVar88[2];
            fVar37 = pfVar88[3];
            fVar38 = pfVar88[5];
            fVar39 = pfVar88[6];
            fVar40 = pfVar88[7];
            fVar41 = pfVar95[0xc];
            fVar42 = pfVar95[0xd];
            fVar43 = pfVar95[0xe];
            fVar44 = pfVar95[0xf];
            fVar45 = pfVar95[0x10];
            fVar46 = pfVar95[0x11];
            fVar47 = pfVar95[0x12];
            fVar48 = pfVar95[0x13];
            fVar49 = pfVar96[0xc];
            fVar50 = pfVar96[0xd];
            fVar51 = pfVar96[0xe];
            fVar52 = pfVar96[0xf];
            fVar53 = pfVar96[0x10];
            fVar54 = pfVar96[0x11];
            fVar55 = pfVar96[0x12];
            fVar56 = pfVar96[0x13];
            fVar57 = pfVar88[0xc];
            fVar58 = pfVar88[0xd];
            fVar59 = pfVar88[0xe];
            fVar60 = pfVar88[0xf];
            fVar61 = pfVar88[0x10];
            fVar62 = pfVar88[0x11];
            fVar63 = pfVar88[0x12];
            fVar64 = pfVar88[0x13];
            *pfVar97 = auVar83._0_4_ * *pfVar95 + local_128 +
                       local_108 * pfVar95[4] + auVar101._0_4_ * auVar81._0_4_ +
                       fVar77 * *pfVar96 + auVar82._0_4_ * pfVar96[4] + auVar17._0_4_ * local_e8 +
                       fVar73 * *pfVar88 + local_b8 * pfVar88[4] + auVar99._0_4_ * local_78;
            pfVar97[1] = auVar83._4_4_ * fVar23 + fStack_124 +
                         fStack_104 * fVar26 + auVar101._4_4_ * auVar81._4_4_ +
                         fVar78 * fVar29 + auVar82._4_4_ * fVar32 + auVar17._4_4_ * fStack_e4 +
                         fVar74 * fVar35 + fStack_b4 * fVar38 + auVar99._4_4_ * fStack_74;
            pfVar97[2] = auVar83._8_4_ * fVar24 + fStack_120 +
                         fStack_100 * fVar27 + auVar101._8_4_ * auVar81._8_4_ +
                         fVar79 * fVar30 + auVar82._8_4_ * fVar33 + auVar17._8_4_ * fStack_e0 +
                         fVar75 * fVar36 + fStack_b0 * fVar39 + auVar99._8_4_ * fStack_70;
            pfVar97[3] = fStack_9c * fVar25 + fStack_11c +
                         fStack_fc * fVar28 + auVar101._12_4_ * fStack_bc +
                         fVar80 * fVar31 + fStack_cc * fVar34 + auVar17._12_4_ * fStack_dc +
                         fVar76 * fVar37 + fStack_ac * fVar40 + auVar99._12_4_ * fStack_6c;
            auVar100._0_4_ =
                 auVar101._0_4_ * auVar83._0_4_ + local_128 +
                 auVar17._0_4_ * fVar77 + auVar99._0_4_ * fVar73 +
                 local_108 * fVar41 + auVar82._0_4_ * fVar49 + local_b8 * fVar57 +
                 auVar81._0_4_ * fVar45 + local_e8 * fVar53 + local_78 * fVar61;
            auVar100._4_4_ =
                 auVar101._4_4_ * auVar83._4_4_ + fStack_124 +
                 auVar17._4_4_ * fVar78 + auVar99._4_4_ * fVar74 +
                 fStack_104 * fVar42 + auVar82._4_4_ * fVar50 + fStack_b4 * fVar58 +
                 auVar81._4_4_ * fVar46 + fStack_e4 * fVar54 + fStack_74 * fVar62;
            auVar100._8_4_ =
                 auVar101._8_4_ * auVar83._8_4_ + fStack_120 +
                 auVar17._8_4_ * fVar79 + auVar99._8_4_ * fVar75 +
                 fStack_100 * fVar43 + auVar82._8_4_ * fVar51 + fStack_b0 * fVar59 +
                 auVar81._8_4_ * fVar47 + fStack_e0 * fVar55 + fStack_70 * fVar63;
            auVar100._12_4_ =
                 auVar101._12_4_ * fStack_9c + fStack_11c +
                 auVar17._12_4_ * fVar80 + auVar99._12_4_ * fVar76 +
                 fStack_fc * fVar44 + fStack_cc * fVar52 + fStack_ac * fVar60 +
                 fStack_bc * fVar48 + fStack_dc * fVar56 + fStack_6c * fVar64;
            *(undefined1 (*) [16])(pfVar97 + 4) = auVar100;
            pfVar95 = pfVar95 + 0x10;
            pfVar96 = pfVar96 + 0x10;
            pfVar88 = pfVar88 + 0x10;
            pfVar97 = pfVar97 + 8;
            uVar91 = uVar90 + 3;
            uVar90 = uVar90 + 2;
          }
          iVar89 = uVar19 - uVar90;
          if (iVar89 != 0 && (int)uVar90 <= (int)uVar19) {
            lVar87 = 0;
            lVar92 = 0;
            do {
              pfVar3 = (float *)((long)pfVar95 + lVar92 * 2);
              pfVar6 = (float *)((long)pfVar95 + lVar92 * 2 + 0x10);
              pfVar7 = (float *)((long)pfVar95 + lVar92 * 2 + 0x20);
              pfVar12 = (float *)((long)pfVar96 + lVar92 * 2);
              pfVar8 = (float *)((long)pfVar96 + lVar92 * 2 + 0x10);
              pfVar9 = (float *)((long)pfVar96 + lVar92 * 2 + 0x20);
              pfVar4 = (float *)((long)pfVar88 + lVar92 * 2);
              pfVar10 = (float *)((long)pfVar88 + lVar92 * 2 + 0x10);
              pfVar11 = (float *)((long)pfVar88 + lVar92 * 2 + 0x20);
              auVar101._0_4_ =
                   local_a8 * *pfVar3 + local_128 + local_108 * *pfVar6 + auVar84._0_4_ * *pfVar7 +
                   fVar77 * *pfVar12 + auVar85._0_4_ * *pfVar8 + local_e8 * *pfVar9 +
                   fVar73 * *pfVar4 + local_b8 * *pfVar10 + local_78 * *pfVar11;
              auVar101._4_4_ =
                   fStack_a4 * pfVar3[1] + fStack_124 +
                   fStack_104 * pfVar6[1] + auVar84._4_4_ * pfVar7[1] +
                   fVar78 * pfVar12[1] + auVar85._4_4_ * pfVar8[1] + fStack_e4 * pfVar9[1] +
                   fVar74 * pfVar4[1] + fStack_b4 * pfVar10[1] + fStack_74 * pfVar11[1];
              auVar101._8_4_ =
                   fStack_a0 * pfVar3[2] + fStack_120 +
                   fStack_100 * pfVar6[2] + auVar84._8_4_ * pfVar7[2] +
                   fVar79 * pfVar12[2] + auVar85._8_4_ * pfVar8[2] + fStack_e0 * pfVar9[2] +
                   fVar75 * pfVar4[2] + fStack_b0 * pfVar10[2] + fStack_70 * pfVar11[2];
              auVar101._12_4_ =
                   fStack_9c * pfVar3[3] + fStack_11c +
                   fStack_fc * pfVar6[3] + fStack_bc * pfVar7[3] +
                   fVar80 * pfVar12[3] + fStack_cc * pfVar8[3] + fStack_dc * pfVar9[3] +
                   fVar76 * pfVar4[3] + fStack_ac * pfVar10[3] + fStack_6c * pfVar11[3];
              *(undefined1 (*) [16])((long)pfVar97 + lVar92) = auVar101;
              lVar92 = lVar92 + 0x10;
              lVar87 = lVar87 + -0x20;
              iVar89 = iVar89 + -1;
            } while (iVar89 != 0);
            pfVar97 = (float *)((long)pfVar97 + lVar92);
            pfVar95 = (float *)((long)pfVar95 - lVar87);
            pfVar96 = (float *)((long)pfVar96 - lVar87);
            pfVar88 = (float *)((long)pfVar88 - lVar87);
          }
          pfVar95 = pfVar95 + iVar86;
          pfVar96 = pfVar96 + iVar86;
          pfVar88 = pfVar88 + iVar86;
          iVar93 = iVar93 + 1;
        } while (iVar93 != iVar20);
      }
      lVar94 = lVar94 + 1;
    } while (lVar94 != iVar18);
  }
  return;
}

Assistant:

static void convdw3x3s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 4;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_loadu_ps(k0);
        __m128 _k01 = _mm_loadu_ps(k0 + 4);
        __m128 _k02 = _mm_loadu_ps(k0 + 8);
        __m128 _k10 = _mm_loadu_ps(k0 + 12);
        __m128 _k11 = _mm_loadu_ps(k0 + 16);
        __m128 _k12 = _mm_loadu_ps(k0 + 20);
        __m128 _k20 = _mm_loadu_ps(k0 + 24);
        __m128 _k21 = _mm_loadu_ps(k0 + 28);
        __m128 _k22 = _mm_loadu_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r05 = _mm_loadu_ps(r0 + 20);
                __m128 _r15 = _mm_loadu_ps(r1 + 20);
                __m128 _r25 = _mm_loadu_ps(r2 + 20);
                __m128 _r06 = _mm_loadu_ps(r0 + 24);
                __m128 _r16 = _mm_loadu_ps(r1 + 24);
                __m128 _r26 = _mm_loadu_ps(r2 + 24);
                _mm_storeu_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r26, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r07 = _mm_loadu_ps(r0 + 28);
                __m128 _r17 = _mm_loadu_ps(r1 + 28);
                __m128 _r27 = _mm_loadu_ps(r2 + 28);
                __m128 _r08 = _mm_loadu_ps(r0 + 32);
                __m128 _r18 = _mm_loadu_ps(r1 + 32);
                __m128 _r28 = _mm_loadu_ps(r2 + 32);
                _mm_storeu_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm_storeu_ps(outptr0 + 12, _sum3);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);
                _mm_storeu_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm_storeu_ps(outptr0 + 4, _sum1);

                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm_storeu_ps(outptr0, _sum0);
                r0 += 2 * 4;
                r1 += 2 * 4;
                r2 += 2 * 4;
                outptr0 += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}